

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this_00;
  Variant *pVVar1;
  size_t sVar2;
  _Hash_node_base *p_Var3;
  TypedID<(diligent_spirv_cross::Types)0> *insert_begin;
  long lVar4;
  TypedID<(diligent_spirv_cross::Types)0> TVar5;
  SPIRExpression *pSVar6;
  ulong uVar7;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar8;
  SPIRVariable *pSVar9;
  SPIRExpression *pSVar10;
  ulong uVar11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  TypedID<(diligent_spirv_cross::Types)0> local_2c;
  
  uVar12 = (ulong)dst;
  local_2c.id = source_expression;
  if ((uVar12 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar1[uVar12].type == TypeExpression)) {
    pSVar6 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar1 + uVar12);
  }
  else {
    pSVar6 = (SPIRExpression *)0x0;
  }
  if ((((pSVar6 != (SPIRExpression *)0x0) && (this->position_invariant != false)) &&
      (uVar7 = (ulong)local_2c.id,
      uVar7 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size)) &&
     (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar1[uVar7].type == TypeExpression)) {
    Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar1 + uVar7);
    pTVar8 = (pSVar6->invariance_dependencies).
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
    pTVar8 = ::std::
             __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       (pTVar8,pTVar8 + (pSVar6->invariance_dependencies).
                                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                        .buffer_size,&local_2c);
    TVar5.id = local_2c.id;
    sVar2 = (pSVar6->invariance_dependencies).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
            buffer_size;
    if (pTVar8 == (pSVar6->invariance_dependencies).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                  ptr + sVar2) {
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                (&pSVar6->invariance_dependencies,sVar2 + 1);
      sVar2 = (pSVar6->invariance_dependencies).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      (pSVar6->invariance_dependencies).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr[sVar2].id
           = TVar5.id;
      (pSVar6->invariance_dependencies).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size =
           sVar2 + 1;
    }
  }
  uVar7 = (this->forwarded_temporaries)._M_h._M_bucket_count;
  uVar11 = uVar12 % uVar7;
  p_Var13 = (this->forwarded_temporaries)._M_h._M_buckets[uVar11];
  p_Var14 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var13->_M_nxt, p_Var14 = p_Var13, *(uint32_t *)&p_Var13->_M_nxt[1]._M_nxt != dst))
  {
    while (p_Var13 = p_Var3, p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var14 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar7 != uVar11) ||
         (p_Var14 = p_Var13, *(uint *)&p_Var3[1]._M_nxt == dst)) goto LAB_007c31ce;
    }
    p_Var14 = (__node_base_ptr)0x0;
  }
LAB_007c31ce:
  if ((p_Var14 != (__node_base_ptr)0x0) && (p_Var14->_M_nxt != (_Hash_node_base *)0x0)) {
    uVar7 = (this->forced_temporaries)._M_h._M_bucket_count;
    uVar12 = uVar12 % uVar7;
    p_Var13 = (this->forced_temporaries)._M_h._M_buckets[uVar12];
    p_Var14 = (__node_base_ptr)0x0;
    if ((p_Var13 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var13->_M_nxt, p_Var14 = p_Var13, *(uint32_t *)&p_Var13->_M_nxt[1]._M_nxt != dst)
       ) {
      while (p_Var13 = p_Var3, p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var14 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar7 != uVar12) ||
           (p_Var14 = p_Var13, *(uint *)&p_Var3[1]._M_nxt == dst)) goto LAB_007c3240;
      }
      p_Var14 = (__node_base_ptr)0x0;
    }
LAB_007c3240:
    if ((p_Var14 == (__node_base_ptr)0x0) || (p_Var14->_M_nxt == (_Hash_node_base *)0x0)) {
      uVar12 = (ulong)local_2c.id;
      if ((uVar12 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar1[uVar12].type == TypeVariable)) {
        pSVar9 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar1 + uVar12);
      }
      else {
        pSVar9 = (SPIRVariable *)0x0;
      }
      if ((pSVar9 != (SPIRVariable *)0x0) && (pSVar9->phi_variable == true)) {
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                  (&pSVar9->dependees,
                   (pSVar9->dependees).
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                   buffer_size + 1);
        sVar2 = (pSVar9->dependees).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                buffer_size;
        (pSVar9->dependees).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr[sVar2].
        id = dst;
        (pSVar9->dependees).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size
             = sVar2 + 1;
      }
      uVar12 = (ulong)local_2c.id;
      if ((uVar12 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
         (pVVar1 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
         pVVar1[uVar12].type == TypeExpression)) {
        pSVar10 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar1 + uVar12);
      }
      else {
        pSVar10 = (SPIRExpression *)0x0;
      }
      TVar5.id = local_2c.id;
      if (pSVar10 != (SPIRExpression *)0x0) {
        this_00 = &pSVar6->expression_dependencies;
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                  (this_00,(pSVar6->expression_dependencies).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                           .buffer_size + 1);
        sVar2 = (pSVar6->expression_dependencies).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                buffer_size;
        pTVar8 = (pSVar6->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 ptr + sVar2;
        pTVar8->id = TVar5.id;
        (pSVar6->expression_dependencies).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size
             = sVar2 + 1;
        insert_begin = (pSVar10->expression_dependencies).
                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                       .ptr;
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
                  (this_00,pTVar8 + 1,insert_begin,
                   insert_begin +
                   (pSVar10->expression_dependencies).
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                   buffer_size);
        uVar12 = (pSVar6->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 buffer_size;
        if (uVar12 != 0) {
          pTVar8 = (this_00->
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>)
                   .ptr;
          lVar4 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          ::std::
          __introsort_loop<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar8,pTVar8 + uVar12,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          ::std::
          __final_insertion_sort<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar8,pTVar8 + uVar12);
        }
        pTVar8 = (pSVar6->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 ptr;
        pTVar8 = ::std::
                 __unique<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (pTVar8,pTVar8 + (pSVar6->expression_dependencies).
                                            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                            .buffer_size);
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::erase
                  (this_00,pTVar8,
                   (pSVar6->expression_dependencies).
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                   ptr + (pSVar6->expression_dependencies).
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         .buffer_size);
      }
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	auto *ptr_e = maybe_get<SPIRExpression>(dst);

	if (is_position_invariant() && ptr_e && maybe_get<SPIRExpression>(source_expression))
	{
		auto &deps = ptr_e->invariance_dependencies;
		if (std::find(deps.begin(), deps.end(), source_expression) == deps.end())
			deps.push_back(source_expression);
	}

	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = *ptr_e;
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}